

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O2

int mwFlushR(void)

{
  if (mwFlushing == mwFlushingB2 && mwFlushing == mwFlushingB1) {
    return mwFlushing;
  }
  if (mwFlushing == mwFlushingB1) {
    mwFlushingB2 = mwFlushing;
  }
  else if (mwFlushing != mwFlushingB2) goto LAB_001081bb;
  mwFlushingB1 = mwFlushing;
LAB_001081bb:
  if (mwFlushingB1 == mwFlushingB2) {
    mwFlushing = mwFlushingB2;
  }
  if (mwFlushingB2 == mwFlushing && mwFlushingB1 == mwFlushing) {
    mwWrite("internal: flushing flag damaged and recovered\n");
    mwFlush();
  }
  else {
    mwWrite("internal: flushing flag destroyed, so set to true\n");
    mwFlushingB2 = 1;
    mwFlushingB1 = mwFlushingB2;
    mwFlushing = mwFlushingB2;
  }
  return mwFlushing;
}

Assistant:

static int mwFlushR()
{
	if ((mwFlushing == mwFlushingB1) && (mwFlushing == mwFlushingB2)) {
		return mwFlushing;
	}
	if (mwFlushing == mwFlushingB1) {
		mwFlushingB2 = mwFlushing;
	}
	if (mwFlushing == mwFlushingB2) {
		mwFlushingB1 = mwFlushing;
	}
	if (mwFlushingB1 == mwFlushingB2) {
		mwFlushing = mwFlushingB1;
	}
	if ((mwFlushing == mwFlushingB1) && (mwFlushing == mwFlushingB2)) {
		mwWrite("internal: flushing flag damaged and recovered\n");
		FLUSH();
		return mwFlushing;
	}
	mwWrite("internal: flushing flag destroyed, so set to true\n");
	mwFlushing = mwFlushingB1 = mwFlushingB2 = 1;
	return 1;
}